

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<tcu::Texture3D>::SharedPtr(SharedPtr<tcu::Texture3D> *this,Texture3D *ptr)

{
  Texture3D *pTVar1;
  SharedPtrState<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *pSVar2;
  DefaultDeleter<tcu::Texture3D> local_25 [13];
  Texture3D *local_18;
  Texture3D *ptr_local;
  SharedPtr<tcu::Texture3D> *this_local;
  
  this->m_ptr = (Texture3D *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (Texture3D *)this;
  pSVar2 = (SharedPtrState<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *)operator_new(0x20)
  ;
  pTVar1 = local_18;
  DefaultDeleter<tcu::Texture3D>::DefaultDeleter(local_25);
  SharedPtrState<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>::SharedPtrState(pSVar2,pTVar1)
  ;
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}